

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyLayerContent
          (LayeredRenderCase *this,Surface *layer,int layerNdx)

{
  TestLog *this_00;
  MessageBuilder *this_01;
  float local_2f8;
  float local_2ec;
  float local_2e4;
  undefined1 local_284 [8];
  Vec4 layerColor;
  MessageBuilder local_268;
  undefined1 local_e8 [8];
  Vec4 colors [6];
  Vec4 magenta;
  Vec4 yellow;
  Vec4 blue;
  Vec4 green;
  Vec4 red;
  Vec4 white;
  int layerNdx_local;
  Surface *layer_local;
  LayeredRenderCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(red.m_data + 2),1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(magenta.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[5].m_data + 3),1.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e8,(Vector<float,_4> *)(red.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[0].m_data + 2),(Vector<float,_4> *)(green.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[1].m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[2].m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[3].m_data + 2),(Vector<float,_4> *)(magenta.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[4].m_data + 2),(Vector<float,_4> *)(colors[5].m_data + 3));
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_268,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_268,(char (*) [25])"Verifying layer contents");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_268);
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    if (layerNdx == 0) {
      this_local._7_1_ = verifyImageSingleColoredRow(this,layer,0.5,(Vec4 *)(red.m_data + 2),true);
    }
    else {
      this_local._7_1_ = verifyEmptyImage(this,layer,true);
    }
    break;
  case TEST_SINGLE_LAYER:
    if (layerNdx == this->m_targetLayer) {
      this_local._7_1_ = verifyImageSingleColoredRow(this,layer,0.5,(Vec4 *)(red.m_data + 2),true);
    }
    else {
      this_local._7_1_ = verifyEmptyImage(this,layer,true);
    }
    break;
  case TEST_ALL_LAYERS:
  case TEST_INVOCATION_PER_LAYER:
    this_local._7_1_ =
         verifyImageSingleColoredRow
                   (this,layer,0.5,(Vec4 *)(colors[(long)layerNdx + -1].m_data + 2),true);
    break;
  case TEST_DIFFERENT_LAYERS:
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    if (layerNdx == 0) {
      this_local._7_1_ = verifyEmptyImage(this,layer,true);
    }
    else {
      this_local._7_1_ =
           verifyImageSingleColoredRow
                     (this,layer,(float)layerNdx / (float)this->m_numLayers,(Vec4 *)(red.m_data + 2)
                      ,true);
    }
    break;
  case TEST_LAYER_ID:
    local_2e4 = 1.0;
    if (layerNdx % 2 != 1) {
      local_2e4 = 0.5;
    }
    local_2ec = 1.0;
    if ((int)((long)((ulong)(uint)((int)((long)layerNdx / 2) >> 0x1f) << 0x20 |
                    (long)layerNdx / 2 & 0xffffffffU) % 2) != 1) {
      local_2ec = 0.5;
    }
    local_2f8 = 1.0;
    if (layerNdx != 0) {
      local_2f8 = 0.0;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_284,local_2e4,local_2ec,local_2f8,1.0);
    this_local._7_1_ = verifyImageSingleColoredRow(this,layer,0.5,(Vec4 *)local_284,true);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    if (this->m_provokingVertex == 0x8e4d) {
      if (layerNdx == 0) {
        this_local._7_1_ = verifyImageSingleColoredRow(this,layer,0.5,(Vec4 *)(red.m_data + 2),true)
        ;
      }
      else {
        this_local._7_1_ = verifyEmptyImage(this,layer,true);
      }
    }
    else if (this->m_provokingVertex == 0x8e4e) {
      if (layerNdx == 1) {
        this_local._7_1_ = verifyImageSingleColoredRow(this,layer,0.5,(Vec4 *)(red.m_data + 2),true)
        ;
      }
      else {
        this_local._7_1_ = verifyEmptyImage(this,layer,true);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LayeredRenderCase::verifyLayerContent (const tcu::Surface& layer, int layerNdx)
{
	const tcu::Vec4 white   = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red     = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green   = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue    = tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow  = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 magenta = tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 colors[6] = { white, red, green, blue, yellow, magenta };

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying layer contents" << tcu::TestLog::EndMessage;

	switch (m_test)
	{
		case TEST_DEFAULT_LAYER:
			if (layerNdx == 0)
				return verifyImageSingleColoredRow(layer, 0.5f, white);
			else
				return verifyEmptyImage(layer);

		case TEST_SINGLE_LAYER:
			if (layerNdx == m_targetLayer)
				return verifyImageSingleColoredRow(layer, 0.5f, white);
			else
				return verifyEmptyImage(layer);

		case TEST_ALL_LAYERS:
		case TEST_INVOCATION_PER_LAYER:
			return verifyImageSingleColoredRow(layer, 0.5f, colors[layerNdx]);

		case TEST_DIFFERENT_LAYERS:
		case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
			if (layerNdx == 0)
				return verifyEmptyImage(layer);
			else
				return verifyImageSingleColoredRow(layer, (float)layerNdx / (float)m_numLayers, white);

		case TEST_LAYER_ID:
		{
			const tcu::Vec4 layerColor((layerNdx % 2 == 1) ? (1.0f) : (0.5f),
									   ((layerNdx/2) % 2 == 1) ? (1.0f) : (0.5f),
									   (layerNdx == 0) ? (1.0f) : (0.0f),
									   1.0f);
			return verifyImageSingleColoredRow(layer, 0.5f, layerColor);
		}

		case TEST_LAYER_PROVOKING_VERTEX:
			if (m_provokingVertex == GL_FIRST_VERTEX_CONVENTION)
			{
				if (layerNdx == 0)
					return verifyImageSingleColoredRow(layer, 0.5f, white);
				else
					return verifyEmptyImage(layer);
			}
			else if (m_provokingVertex == GL_LAST_VERTEX_CONVENTION)
			{
				if (layerNdx == 1)
					return verifyImageSingleColoredRow(layer, 0.5f, white);
				else
					return verifyEmptyImage(layer);
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}

		default:
			DE_ASSERT(DE_FALSE);
			return false;
	};
}